

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGMPBigInt.cpp
# Opt level: O2

CGMPBigInt * __thiscall CGMPBigInt::MulRate(CGMPBigInt *this,float fRatio)

{
  mpz_t temp;
  __mpz_struct local_28;
  
  mpz_init(&local_28);
  mpz_mul_si(&local_28,this->m_value,(long)(fRatio * 1000.0));
  mpz_fdiv_q_ui(this->m_value,&local_28,1000);
  mpz_clear(&local_28);
  return this;
}

Assistant:

CGMPBigInt &CGMPBigInt::MulRate(float fRatio)
{
    mpz_t temp;
    mpz_init(temp);
    mpz_mul_si(temp, m_value, (long)(fRatio*1000));
    mpz_fdiv_q_ui(m_value, temp, 1000);
    mpz_clear(temp);
    return *this;
}